

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86.cpp
# Opt level: O2

int __thiscall
ncnn::MultiHeadAttention_x86::forward
          (MultiHeadAttention_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  size_t sVar8;
  long *plVar9;
  int iVar10;
  undefined4 uVar11;
  long lVar12;
  Allocator *pAVar13;
  int iVar14;
  Allocator *pAVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int _w;
  pointer pMVar21;
  long lVar22;
  pointer pMVar23;
  void *pvVar24;
  long local_310;
  Option opt1;
  long local_2a8;
  Mat local_298;
  long local_248;
  MultiHeadAttention_x86 *local_240;
  Mat local_238;
  Option *local_1f0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_bottom_blobs;
  void *local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 local_188;
  undefined4 uStack_184;
  int local_180;
  Allocator *local_178;
  undefined4 uStack_170;
  int iStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_160;
  undefined8 local_158;
  void *local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  undefined4 uStack_134;
  int local_130;
  Allocator *local_128;
  undefined4 uStack_120;
  int iStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 local_110;
  undefined8 local_108;
  Mat local_f8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_b0;
  pointer local_a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_bottom_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_top_blobs;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar17 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar4;
  pMVar21 = pMVar4;
  pMVar23 = pMVar4;
  if (lVar17 / 0x48 != 1) {
    if (lVar17 / 0x48 == 2) {
      if (*(int *)(&this->field_0xe4 + (long)this->_vptr_MultiHeadAttention_x86[-3]) == 0) {
        pMVar21 = pMVar4 + 1;
        pMVar23 = pMVar4 + 1;
      }
    }
    else {
      pMVar21 = pMVar4 + 1;
      if ((lVar17 != 0xd8) ||
         (pMVar23 = pMVar21,
         *(int *)(&this->field_0xe4 + (long)this->_vptr_MultiHeadAttention_x86[-3]) == 0)) {
        pMVar23 = pMVar4 + 2;
      }
    }
  }
  if (*(int *)(&this->field_0xe4 + (long)this->_vptr_MultiHeadAttention_x86[-3]) == 0) {
    local_238.cstep = 0;
    local_238.data = (void *)0x0;
    local_238.refcount._0_4_ = 0;
    local_238.refcount._4_4_ = 0;
    local_238.elemsize._0_4_ = 0;
    local_238.elemsize._4_4_ = 0;
    local_238.elempack = 0;
    local_238.allocator = (Allocator *)0x0;
    local_238.dims = 0;
    local_238.w = 0;
    local_238.h = 0;
    local_238.d = 0;
    local_238.c = 0;
  }
  else {
    local_238.data = *(void **)((long)pMVar4 + lVar17 + -0x48);
    piVar5 = *(int **)((long)pMVar4 + lVar17 + -0x40);
    local_238.refcount._0_4_ = SUB84(piVar5,0);
    local_238.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
    uVar6 = *(undefined8 *)((long)pMVar4 + lVar17 + -0x38);
    local_238.elemsize._0_4_ = (undefined4)uVar6;
    local_238.elemsize._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    local_238.elempack = *(int *)((long)pMVar4 + lVar17 + -0x30);
    local_238.allocator = *(Allocator **)((long)pMVar4 + lVar17 + -0x28);
    puVar1 = (undefined8 *)((long)pMVar4 + lVar17 + -0x20);
    uVar6 = *puVar1;
    uVar7 = puVar1[1];
    local_238.dims = (int)uVar6;
    local_238.w = (int)((ulong)uVar6 >> 0x20);
    local_238.h = (int)uVar7;
    local_238.d = (int)((ulong)uVar7 >> 0x20);
    local_238.c = *(int *)((long)pMVar4 + lVar17 + -0x10);
    local_238.cstep = *(size_t *)((long)pMVar4 + lVar17 + -8);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
  }
  local_298.cstep = 0;
  local_298.data = (void *)0x0;
  local_298.refcount._0_4_ = 0;
  local_298.refcount._4_4_ = 0;
  local_298.elemsize._0_4_ = 0;
  local_298.elemsize._4_4_ = 0;
  local_298.elempack = 0;
  local_298.allocator = (Allocator *)0x0;
  local_298.dims = 0;
  local_298.w = 0;
  local_298.h = 0;
  local_298.d = 0;
  local_298.c = 0;
  local_b0 = top_blobs;
  if (local_238.elempack == 1) {
    piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    local_298.data = local_238.data;
    local_298.refcount._0_4_ = local_238.refcount._0_4_;
    local_298.refcount._4_4_ = local_238.refcount._4_4_;
    local_298.elemsize._0_4_ = (undefined4)local_238.elemsize;
    local_298.elemsize._4_4_ = local_238.elemsize._4_4_;
    local_298.elempack = local_238.elempack;
    local_298.allocator = local_238.allocator;
    local_298.dims = local_238.dims;
    local_298.w = local_238.w;
    local_298.h = local_238.h;
    local_298.d = local_238.d;
    local_298.c = local_238.c;
    local_298.cstep = local_238.cstep;
  }
  else {
    convert_packing(&local_238,&local_298,1,opt);
  }
  iVar16 = *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]) /
           *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]);
  _w = pMVar4->elempack * pMVar4->h;
  iVar2 = pMVar21->elempack;
  iVar3 = pMVar21->h;
  local_108 = 0;
  local_148 = (void *)0x0;
  uStack_140 = 0;
  uStack_13c = 0;
  local_138 = 0;
  uStack_134 = 0;
  local_130 = 0;
  local_128 = (Allocator *)0x0;
  uStack_120 = 0;
  iStack_11c = 0;
  uStack_118 = 0;
  uStack_114 = 0;
  local_110 = 0;
  local_a8 = pMVar23;
  (*this->q_gemm->_vptr_Layer[7])(this->q_gemm,pMVar4,&local_148,opt);
  local_158 = 0;
  local_198 = (void *)0x0;
  uStack_190 = 0;
  uStack_18c = 0;
  local_188 = 0;
  uStack_184 = 0;
  local_180 = 0;
  local_178 = (Allocator *)0x0;
  uStack_170 = 0;
  iStack_16c = 0;
  uStack_168 = 0;
  uStack_164 = 0;
  local_160 = 0;
  (*this->k_gemm->_vptr_Layer[7])(this->k_gemm,pMVar21,&local_198,opt);
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elemsize._4_4_ = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  Mat::create(&local_f8,iVar2 * iVar3,
              *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]) * _w,4,
              opt->blob_allocator);
  lVar17 = (long)iVar16;
  local_248 = (long)_w;
  local_2a8 = 0;
  lVar22 = 0;
  local_240 = this;
  local_1f0 = opt;
  for (lVar18 = 0;
      lVar18 < *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]);
      lVar18 = lVar18 + 1) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&qk_bottom_blobs,2,(allocator_type *)&opt1);
    iVar3 = iStack_11c;
    pAVar15 = local_128;
    iVar2 = local_130;
    pMVar21 = qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar19 = (long)iStack_11c;
    sVar8 = CONCAT44(uStack_134,local_138);
    pvVar24 = (void *)(lVar22 * lVar19 * sVar8 + (long)local_148);
    piVar5 = (qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if ((qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          free((qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start)->data);
        }
        else {
          (*(qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    iVar14 = iStack_16c;
    pAVar13 = local_178;
    iVar10 = local_180;
    pMVar4 = qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar21->data = pvVar24;
    pMVar21->refcount = (int *)0x0;
    pMVar21->elemsize = sVar8;
    pMVar21->elempack = iVar2;
    pMVar21->allocator = pAVar15;
    pMVar21->dims = 2;
    pMVar21->w = iVar3;
    pMVar21->h = iVar16;
    pMVar21->d = 1;
    pMVar21->c = 1;
    pMVar21->cstep = lVar19 * lVar17;
    lVar19 = (long)iStack_16c;
    sVar8 = CONCAT44(uStack_184,local_188);
    piVar5 = qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].refcount;
    pvVar24 = (void *)(lVar22 * lVar19 * sVar8 + (long)local_198);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
          free(qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start[1].data);
        }
        else {
          (*(qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pMVar4[1].data = pvVar24;
    pMVar4[1].refcount = (int *)0x0;
    pMVar4[1].elemsize = sVar8;
    pMVar4[1].elempack = iVar10;
    pMVar4[1].allocator = pAVar13;
    pMVar4[1].dims = 2;
    pMVar4[1].w = iVar14;
    pMVar4[1].h = iVar16;
    pMVar4[1].d = 1;
    pMVar4[1].c = 1;
    pMVar4[1].cstep = lVar19 * lVar17;
    if (*(int *)(&local_240->field_0xe4 + (long)local_240->_vptr_MultiHeadAttention_x86[-3]) != 0) {
      if (local_298.dims == 3) {
        opt1._0_8_ = local_298.cstep * lVar18 *
                     CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize) +
                     (long)local_298.data;
        opt1.blob_allocator._0_4_ = 0;
        opt1.blob_allocator._4_4_ = 0;
        opt1.use_local_pool_allocator = true;
        opt1.use_shader_local_memory = false;
        opt1.use_cooperative_matrix = false;
        opt1.use_winograd23_convolution = false;
        opt1.use_winograd43_convolution = (bool)(undefined1)local_298.d;
        opt1.use_winograd63_convolution = (bool)local_298.d._1_1_;
        opt1.use_a53_a55_optimized_kernel = (bool)local_298.d._2_1_;
        opt1.use_reserved_7 = (bool)local_298.d._3_1_;
        opt1.use_shader_pack8 = true;
        opt1.use_subgroup_basic = false;
        opt1.use_subgroup_vote = false;
        opt1.use_subgroup_ballot = false;
      }
      else {
        piVar5 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
        opt1._0_8_ = local_298.data;
        opt1.blob_allocator._0_4_ = local_298.refcount._0_4_;
        opt1.blob_allocator._4_4_ = local_298.refcount._4_4_;
        opt1.use_shader_pack8 = (bool)(undefined1)local_298.dims;
        opt1.use_subgroup_basic = (bool)local_298.dims._1_1_;
        opt1.use_subgroup_vote = (bool)local_298.dims._2_1_;
        opt1.use_subgroup_ballot = (bool)local_298.dims._3_1_;
        opt1.use_local_pool_allocator = (bool)(undefined1)local_298.d;
        opt1.use_shader_local_memory = (bool)local_298.d._1_1_;
        opt1.use_cooperative_matrix = (bool)local_298.d._2_1_;
        opt1.use_winograd23_convolution = (bool)local_298.d._3_1_;
        opt1.use_winograd43_convolution = (bool)(undefined1)local_298.c;
        opt1.use_winograd63_convolution = (bool)local_298.c._1_1_;
        opt1.use_a53_a55_optimized_kernel = (bool)local_298.c._2_1_;
        opt1.use_reserved_7 = (bool)local_298.c._3_1_;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
      }
      opt1.flush_denormals = local_298.h;
      opt1.use_subgroup_shuffle = (bool)(undefined1)local_298.w;
      opt1.use_image_storage = (bool)local_298.w._1_1_;
      opt1.use_tensor_storage = (bool)local_298.w._2_1_;
      opt1.use_reserved_0 = (bool)local_298.w._3_1_;
      opt1._32_8_ = local_298.allocator;
      opt1.openmp_blocktime = local_298.elempack;
      opt1.workspace_allocator._4_4_ = local_298.elemsize._4_4_;
      opt1.workspace_allocator._0_4_ = (undefined4)local_298.elemsize;
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                (&qk_bottom_blobs,(value_type *)&opt1);
      piVar5 = (int *)CONCAT44(opt1.blob_allocator._4_4_,opt1.blob_allocator._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (opt1._32_8_ == 0) {
            free((void *)opt1._0_8_);
          }
          else {
            (**(code **)(*(long *)opt1._32_8_ + 0x18))();
          }
        }
      }
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&qk_top_blobs,1,(allocator_type *)&opt1);
    iVar3 = local_f8.w;
    pAVar15 = local_f8.allocator;
    iVar2 = local_f8.elempack;
    lVar20 = (long)local_f8.w;
    lVar19 = CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
    pvVar24 = (void *)(local_2a8 * lVar20 * lVar19 + (long)local_f8.data);
    plVar9 = (long *)CONCAT44(qk_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              qk_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_);
    piVar5 = (int *)plVar9[1];
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if ((long *)plVar9[4] == (long *)0x0) {
          free((void *)*plVar9);
        }
        else {
          (**(code **)(*(long *)plVar9[4] + 0x18))();
        }
      }
    }
    opt = local_1f0;
    this = local_240;
    lVar12 = local_248;
    *plVar9 = (long)pvVar24;
    plVar9[1] = 0;
    plVar9[2] = lVar19;
    *(int *)(plVar9 + 3) = iVar2;
    plVar9[4] = (long)pAVar15;
    *(undefined4 *)(plVar9 + 5) = 2;
    *(int *)((long)plVar9 + 0x2c) = iVar3;
    *(int *)(plVar9 + 6) = _w;
    *(undefined8 *)((long)plVar9 + 0x34) = 0x100000001;
    plVar9[8] = lVar20 * local_248;
    opt1.blob_allocator._0_4_ = *(undefined4 *)&local_1f0->blob_allocator;
    opt1.blob_allocator._4_4_ = *(undefined4 *)((long)&local_1f0->blob_allocator + 4);
    opt1.workspace_allocator._0_4_ = *(undefined4 *)&local_1f0->workspace_allocator;
    opt1.workspace_allocator._4_4_ = *(undefined4 *)((long)&local_1f0->workspace_allocator + 4);
    opt1.openmp_blocktime = local_1f0->openmp_blocktime;
    opt1.use_winograd_convolution = local_1f0->use_winograd_convolution;
    opt1.use_sgemm_convolution = local_1f0->use_sgemm_convolution;
    opt1.use_int8_inference = local_1f0->use_int8_inference;
    opt1.use_vulkan_compute = local_1f0->use_vulkan_compute;
    opt1.use_bf16_storage = local_1f0->use_bf16_storage;
    opt1.use_fp16_packed = local_1f0->use_fp16_packed;
    opt1.use_fp16_storage = local_1f0->use_fp16_storage;
    opt1.use_fp16_arithmetic = local_1f0->use_fp16_arithmetic;
    opt1.use_int8_packed = local_1f0->use_int8_packed;
    opt1.use_int8_storage = local_1f0->use_int8_storage;
    opt1.use_int8_arithmetic = local_1f0->use_int8_arithmetic;
    opt1.use_packing_layout = local_1f0->use_packing_layout;
    opt1.use_shader_pack8 = local_1f0->use_shader_pack8;
    opt1.use_subgroup_basic = local_1f0->use_subgroup_basic;
    opt1.use_subgroup_vote = local_1f0->use_subgroup_vote;
    opt1.use_subgroup_ballot = local_1f0->use_subgroup_ballot;
    opt1.use_subgroup_shuffle = local_1f0->use_subgroup_shuffle;
    opt1.use_image_storage = local_1f0->use_image_storage;
    opt1.use_tensor_storage = local_1f0->use_tensor_storage;
    opt1.use_reserved_0 = local_1f0->use_reserved_0;
    opt1.flush_denormals = local_1f0->flush_denormals;
    opt1.use_local_pool_allocator = local_1f0->use_local_pool_allocator;
    opt1.use_shader_local_memory = local_1f0->use_shader_local_memory;
    opt1.use_cooperative_matrix = local_1f0->use_cooperative_matrix;
    opt1.use_winograd23_convolution = local_1f0->use_winograd23_convolution;
    opt1.use_winograd43_convolution = local_1f0->use_winograd43_convolution;
    opt1.use_winograd63_convolution = local_1f0->use_winograd63_convolution;
    opt1.use_a53_a55_optimized_kernel = local_1f0->use_a53_a55_optimized_kernel;
    opt1.use_reserved_7 = local_1f0->use_reserved_7;
    opt1.use_reserved_8 = local_1f0->use_reserved_8;
    opt1.use_reserved_9 = local_1f0->use_reserved_9;
    opt1.use_reserved_10 = local_1f0->use_reserved_10;
    opt1.use_reserved_11 = local_1f0->use_reserved_11;
    opt1.num_threads = 1;
    opt1.lightmode = local_1f0->lightmode;
    opt1._1_3_ = *(undefined3 *)&local_1f0->field_0x1;
    (*local_240->qk_gemm->_vptr_Layer[6])(local_240->qk_gemm,&qk_bottom_blobs,&qk_top_blobs,&opt1);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&qk_top_blobs);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&qk_bottom_blobs);
    lVar22 = lVar22 + lVar17;
    local_2a8 = local_2a8 + lVar12;
  }
  piVar5 = (int *)CONCAT44(uStack_13c,uStack_140);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_128 == (Allocator *)0x0) {
        free(local_148);
      }
      else {
        (*local_128->_vptr_Allocator[3])();
      }
    }
  }
  local_108 = 0;
  local_148 = (void *)0x0;
  uStack_140 = 0;
  uStack_13c = 0;
  local_138 = 0;
  uStack_134 = 0;
  local_130 = 0;
  local_110 = 0;
  uStack_120 = 0;
  iStack_11c = 0;
  uStack_118 = 0;
  uStack_114 = 0;
  piVar5 = (int *)CONCAT44(uStack_18c,uStack_190);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_178 == (Allocator *)0x0) {
        free(local_198);
      }
      else {
        (*local_178->_vptr_Allocator[3])();
      }
    }
  }
  local_158 = 0;
  local_198 = (void *)0x0;
  uStack_190 = 0;
  uStack_18c = 0;
  local_188 = 0;
  uStack_184 = 0;
  local_180 = 0;
  local_160 = 0;
  uStack_170 = 0;
  iStack_16c = 0;
  uStack_168 = 0;
  uStack_164 = 0;
  (*this->qk_softmax->_vptr_Layer[9])(this->qk_softmax,&local_f8,opt);
  opt1.lightmode = false;
  opt1._1_3_ = 0;
  opt1.num_threads = 0;
  opt1.blob_allocator._0_4_ = 0;
  opt1.blob_allocator._4_4_ = 0;
  opt1.workspace_allocator._0_4_ = 0;
  opt1.workspace_allocator._4_4_ = 0;
  opt1.openmp_blocktime = 0;
  opt1.use_bf16_storage = false;
  opt1.use_fp16_packed = false;
  opt1.use_fp16_storage = false;
  opt1.use_fp16_arithmetic = false;
  opt1.use_int8_packed = false;
  opt1.use_int8_storage = false;
  opt1.use_int8_arithmetic = false;
  opt1.use_packing_layout = false;
  opt1.use_shader_pack8 = false;
  opt1.use_subgroup_basic = false;
  opt1.use_subgroup_vote = false;
  opt1.use_subgroup_ballot = false;
  opt1.use_subgroup_shuffle = false;
  opt1.use_image_storage = false;
  opt1.use_tensor_storage = false;
  opt1.use_reserved_0 = false;
  opt1.flush_denormals = 0;
  opt1.use_local_pool_allocator = false;
  opt1.use_shader_local_memory = false;
  opt1.use_cooperative_matrix = false;
  opt1.use_winograd23_convolution = false;
  opt1.use_winograd43_convolution = false;
  opt1.use_winograd63_convolution = false;
  opt1.use_a53_a55_optimized_kernel = false;
  opt1.use_reserved_7 = false;
  (*this->v_gemm->_vptr_Layer[7])(this->v_gemm,local_a8,&opt1,opt);
  qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  Mat::create((Mat *)&qk_bottom_blobs,_w,
              *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]) * iVar16,4,
              opt->blob_allocator);
  local_310 = 0;
  lVar22 = 0;
  for (lVar18 = 0;
      lVar18 < *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]);
      lVar18 = lVar18 + 1) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&qkv_bottom_blobs,2,(allocator_type *)&qk_top_blobs);
    pMVar21 = qkv_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar3 = local_f8.w;
    pAVar15 = local_f8.allocator;
    iVar2 = local_f8.elempack;
    lVar19 = (long)local_f8.w;
    sVar8 = CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
    pvVar24 = (void *)(lVar22 * lVar19 * sVar8 + (long)local_f8.data);
    piVar5 = (qkv_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if ((qkv_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          free((qkv_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start)->data);
        }
        else {
          (*(qkv_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    pMVar4 = qkv_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = opt1._44_4_;
    uVar6 = opt1._32_8_;
    iVar10 = opt1.openmp_blocktime;
    pMVar21->data = pvVar24;
    pMVar21->refcount = (int *)0x0;
    pMVar21->elemsize = sVar8;
    pMVar21->elempack = iVar2;
    pMVar21->allocator = pAVar15;
    pMVar21->dims = 2;
    pMVar21->w = iVar3;
    pMVar21->h = _w;
    pMVar21->d = 1;
    pMVar21->c = 1;
    pMVar21->cstep = lVar19 * local_248;
    lVar19 = (long)(int)opt1._44_4_;
    sVar8 = CONCAT44(opt1.workspace_allocator._4_4_,opt1.workspace_allocator._0_4_);
    piVar5 = qkv_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].refcount;
    pvVar24 = (void *)(local_310 * lVar19 * sVar8 + opt1._0_8_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (qkv_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
          free(qkv_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start[1].data);
        }
        else {
          (*(qkv_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pMVar4[1].data = pvVar24;
    pMVar4[1].refcount = (int *)0x0;
    pMVar4[1].elemsize = sVar8;
    pMVar4[1].elempack = iVar10;
    pMVar4[1].allocator = (Allocator *)uVar6;
    pMVar4[1].dims = 2;
    pMVar4[1].w = uVar11;
    pMVar4[1].h = iVar16;
    pMVar4[1].d = 1;
    pMVar4[1].c = 1;
    pMVar4[1].cstep = lVar19 * lVar17;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&qkv_top_blobs,1,(allocator_type *)&qk_top_blobs);
    pMVar4 = qkv_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar21 = qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    sVar8 = CONCAT44(qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                     qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    piVar5 = (qkv_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if ((qkv_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          free((qkv_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start)->data);
        }
        else {
          (*(qkv_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    opt = local_1f0;
    this = local_240;
    pMVar4->data = pMVar21;
    pMVar4->refcount = (int *)0x0;
    pMVar4->elemsize = sVar8;
    pMVar4->elempack = 0;
    pMVar4->allocator = (Allocator *)0x0;
    pMVar4->dims = 2;
    pMVar4->w = 0;
    pMVar4->h = iVar16;
    pMVar4->d = 1;
    pMVar4->c = 1;
    pMVar4->cstep = 0;
    qk_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)local_1f0;
    qk_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)&local_1f0->blob_allocator;
    qk_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = *(undefined4 *)((long)&local_1f0->blob_allocator + 4);
    qk_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = *(undefined4 *)&local_1f0->workspace_allocator
    ;
    qk_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         *(undefined4 *)((long)&local_1f0->workspace_allocator + 4);
    qk_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 1;
    (*local_240->qkv_gemm->_vptr_Layer[6])
              (local_240->qkv_gemm,&qkv_bottom_blobs,&qkv_top_blobs,&qk_top_blobs);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&qkv_top_blobs);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&qkv_bottom_blobs);
    lVar22 = lVar22 + local_248;
    local_310 = local_310 + lVar17;
  }
  piVar5 = (int *)CONCAT44(opt1.blob_allocator._4_4_,opt1.blob_allocator._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (opt1._32_8_ == 0) {
        free((void *)opt1._0_8_);
      }
      else {
        (**(code **)(*(long *)opt1._32_8_ + 0x18))();
      }
    }
  }
  opt1.lightmode = false;
  opt1._1_3_ = 0;
  opt1.num_threads = 0;
  opt1.blob_allocator._0_4_ = 0;
  opt1.blob_allocator._4_4_ = 0;
  opt1.workspace_allocator._0_4_ = 0;
  opt1.workspace_allocator._4_4_ = 0;
  opt1.openmp_blocktime = 0;
  opt1.use_winograd43_convolution = false;
  opt1.use_winograd63_convolution = false;
  opt1.use_a53_a55_optimized_kernel = false;
  opt1.use_reserved_7 = false;
  opt1.use_shader_pack8 = false;
  opt1.use_subgroup_basic = false;
  opt1.use_subgroup_vote = false;
  opt1.use_subgroup_ballot = false;
  opt1.use_subgroup_shuffle = false;
  opt1.use_image_storage = false;
  opt1.use_tensor_storage = false;
  opt1.use_reserved_0 = false;
  opt1.flush_denormals = 0;
  opt1.use_local_pool_allocator = false;
  opt1.use_shader_local_memory = false;
  opt1.use_cooperative_matrix = false;
  opt1.use_winograd23_convolution = false;
  (*this->o_gemm->_vptr_Layer[7])
            (this->o_gemm,&qk_bottom_blobs,
             (local_b0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start,opt);
  piVar5 = (int *)CONCAT44(qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                           qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      free(qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start);
    }
  }
  piVar5 = (int *)CONCAT44(opt1.blob_allocator._4_4_,opt1.blob_allocator._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (opt1._32_8_ == 0) {
        free((void *)opt1._0_8_);
      }
      else {
        (**(code **)(*(long *)opt1._32_8_ + 0x18))();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        free(local_f8.data);
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar5 = (int *)CONCAT44(uStack_18c,uStack_190);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_178 == (Allocator *)0x0) {
        free(local_198);
      }
      else {
        (*local_178->_vptr_Allocator[3])();
      }
    }
  }
  piVar5 = (int *)CONCAT44(uStack_13c,uStack_140);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_128 == (Allocator *)0x0) {
        free(local_148);
      }
      else {
        (*local_128->_vptr_Allocator[3])();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_298.allocator == (Allocator *)0x0) {
        free(local_298.data);
      }
      else {
        (*(local_298.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        free(local_238.data);
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int MultiHeadAttention_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    Mat attn_mask_blob_unpacked;
    if (attn_mask_blob.elempack != 1)
    {
        convert_packing(attn_mask_blob, attn_mask_blob_unpacked, 1, opt);
    }
    else
    {
        attn_mask_blob_unpacked = attn_mask_blob;
    }

    const int embed_dim_per_head = embed_dim / num_heads;
    const int src_seqlen = q_blob.h * q_blob.elempack;
    const int dst_seqlen = k_blob.h * k_blob.elempack;

    Mat q_affine;
    q_gemm->forward(q_blob, q_affine, opt);

    Mat k_affine;
    k_gemm->forward(k_blob, k_affine, opt);

    Mat qk_cross(dst_seqlen, src_seqlen * num_heads, 4u, opt.blob_allocator);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qk_bottom_blobs(2);
        qk_bottom_blobs[0] = q_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        qk_bottom_blobs[1] = k_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob_unpacked.dims == 3 ? attn_mask_blob_unpacked.channel(i) : attn_mask_blob_unpacked;
            qk_bottom_blobs.push_back(maskm);
        }
        std::vector<Mat> qk_top_blobs(1);
        qk_top_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        Option opt1 = opt;
        opt1.num_threads = 1;
        qk_gemm->forward(qk_bottom_blobs, qk_top_blobs, opt1);
    }

    q_affine.release();
    k_affine.release();

    qk_softmax->forward_inplace(qk_cross, opt);

    Mat v_affine;
    v_gemm->forward(v_blob, v_affine, opt);

    Mat qkv_cross(src_seqlen, embed_dim_per_head * num_heads, 4u, opt.blob_allocator);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qkv_bottom_blobs(2);
        qkv_bottom_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        qkv_bottom_blobs[1] = v_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        std::vector<Mat> qkv_top_blobs(1);
        qkv_top_blobs[0] = qkv_cross.row_range(i * embed_dim_per_head, embed_dim_per_head);
        Option opt1 = opt;
        opt1.num_threads = 1;
        qkv_gemm->forward(qkv_bottom_blobs, qkv_top_blobs, opt1);
    }

    v_affine.release();

    o_gemm->forward(qkv_cross, top_blobs[0], opt);

    return 0;
}